

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue178_test.cc
# Opt level: O3

void anon_unknown.dwarf_ab8c::_Test_Test::_RunIt(void)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  undefined4 extraout_var;
  Tester *this;
  size_type *psVar4;
  int i_00;
  int i_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 uVar5;
  size_t i;
  ulong uVar6;
  unsigned_long uVar7;
  DB *db;
  string dbpath;
  string start_key;
  WriteBatch batch;
  string end_key;
  size_t num_keys;
  Slice greatest;
  Slice least;
  Options db_options;
  DB *local_2f0;
  string local_2e8;
  undefined1 local_2c8 [32];
  WriteBatch local_2a8;
  string local_288;
  unsigned_long local_268;
  void *local_260;
  void *local_258;
  undefined1 local_250 [16];
  undefined1 local_240 [400];
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  Comparator *local_a0;
  char *pcStack_98;
  Options local_90;
  
  leveldb::test::TmpDir_abi_cxx11_();
  plVar3 = (long *)std::__cxx11::string::append(local_250);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_2e8.field_2._M_allocated_capacity = *psVar4;
    local_2e8.field_2._8_8_ = plVar3[3];
  }
  else {
    local_2e8.field_2._M_allocated_capacity = *psVar4;
    local_2e8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_2e8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((Comparator *)local_250._0_8_ != (Comparator *)local_240) {
    operator_delete((void *)local_250._0_8_);
  }
  leveldb::Options::Options((Options *)local_250);
  leveldb::DestroyDB((leveldb *)&local_258,&local_2e8,(Options *)local_250);
  if (local_258 != (void *)0x0) {
    operator_delete__(local_258);
  }
  leveldb::Options::Options(&local_90);
  local_90.create_if_missing = true;
  local_90.compression = kNoCompression;
  local_250[0] = 1;
  local_250._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue178_test.cc"
  ;
  local_240._0_4_ = 0x28;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_240 + 8));
  leveldb::DB::Open((DB *)&local_2a8,&local_90,&local_2e8,&local_2f0);
  leveldb::test::Tester::IsOk((Tester *)local_250,(Status *)&local_2a8);
  if (local_2a8.rep_._M_dataplus._M_p != (pointer)0x0) {
    operator_delete__(local_2a8.rep_._M_dataplus._M_p);
  }
  leveldb::test::Tester::~Tester((Tester *)local_250);
  leveldb::WriteBatch::WriteBatch(&local_2a8);
  uVar6 = 0;
  uVar5 = extraout_RDX;
  do {
    (anonymous_namespace)::Key1_abi_cxx11_
              ((string *)local_250,(_anonymous_namespace_ *)(uVar6 & 0xffffffff),(int)uVar5);
    local_2c8._0_8_ = local_250._0_8_;
    local_2c8._8_8_ = local_250._8_8_;
    local_288._M_dataplus._M_p = "value for range 1 key";
    local_288._M_string_length = 0x15;
    leveldb::WriteBatch::Put(&local_2a8,(Slice *)local_2c8,(Slice *)&local_288);
    uVar5 = extraout_RDX_00;
    if ((Comparator *)local_250._0_8_ != (Comparator *)local_240) {
      operator_delete((void *)local_250._0_8_);
      uVar5 = extraout_RDX_01;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 1100000);
  local_250[0] = 1;
  local_250._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue178_test.cc"
  ;
  local_240._0_4_ = 0x2f;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_240 + 8));
  local_288._M_dataplus._M_p = local_288._M_dataplus._M_p & 0xffffffffffffff00;
  (*local_2f0->_vptr_DB[4])(local_2c8,local_2f0,&local_288,&local_2a8);
  leveldb::test::Tester::IsOk((Tester *)local_250,(Status *)local_2c8);
  if ((Comparator *)local_2c8._0_8_ != (Comparator *)0x0) {
    operator_delete__((void *)local_2c8._0_8_);
  }
  leveldb::test::Tester::~Tester((Tester *)local_250);
  leveldb::WriteBatch::Clear(&local_2a8);
  uVar6 = 0;
  uVar5 = extraout_RDX_02;
  do {
    (anonymous_namespace)::Key2_abi_cxx11_
              ((string *)local_250,(_anonymous_namespace_ *)(uVar6 & 0xffffffff),(int)uVar5);
    local_2c8._0_8_ = local_250._0_8_;
    local_2c8._8_8_ = local_250._8_8_;
    local_288._M_dataplus._M_p = "value for range 2 key";
    local_288._M_string_length = 0x15;
    leveldb::WriteBatch::Put(&local_2a8,(Slice *)local_2c8,(Slice *)&local_288);
    uVar5 = extraout_RDX_03;
    if ((Comparator *)local_250._0_8_ != (Comparator *)local_240) {
      operator_delete((void *)local_250._0_8_);
      uVar5 = extraout_RDX_04;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 1100000);
  local_250[0] = 1;
  local_250._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue178_test.cc"
  ;
  local_240._0_4_ = 0x36;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_240 + 8));
  local_288._M_dataplus._M_p = local_288._M_dataplus._M_p & 0xffffffffffffff00;
  (*local_2f0->_vptr_DB[4])(local_2c8,local_2f0,&local_288,&local_2a8);
  leveldb::test::Tester::IsOk((Tester *)local_250,(Status *)local_2c8);
  if ((Comparator *)local_2c8._0_8_ != (Comparator *)0x0) {
    operator_delete__((void *)local_2c8._0_8_);
  }
  leveldb::test::Tester::~Tester((Tester *)local_250);
  leveldb::WriteBatch::Clear(&local_2a8);
  uVar6 = 0;
  uVar5 = extraout_RDX_05;
  do {
    (anonymous_namespace)::Key2_abi_cxx11_
              ((string *)local_250,(_anonymous_namespace_ *)(uVar6 & 0xffffffff),(int)uVar5);
    local_2c8._0_8_ = local_250._0_8_;
    local_2c8._8_8_ = local_250._8_8_;
    leveldb::WriteBatch::Delete(&local_2a8,(Slice *)local_2c8);
    uVar5 = extraout_RDX_06;
    if ((Comparator *)local_250._0_8_ != (Comparator *)local_240) {
      operator_delete((void *)local_250._0_8_);
      uVar5 = extraout_RDX_07;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 1100000);
  local_250[0] = 1;
  local_250._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue178_test.cc"
  ;
  local_240._0_4_ = 0x3d;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_240 + 8));
  local_288._M_dataplus._M_p = local_288._M_dataplus._M_p & 0xffffffffffffff00;
  (*local_2f0->_vptr_DB[4])(local_2c8,local_2f0,&local_288,&local_2a8);
  leveldb::test::Tester::IsOk((Tester *)local_250,(Status *)local_2c8);
  if ((Comparator *)local_2c8._0_8_ != (Comparator *)0x0) {
    operator_delete__((void *)local_2c8._0_8_);
  }
  leveldb::test::Tester::~Tester((Tester *)local_250);
  (anonymous_namespace)::Key1_abi_cxx11_((string *)local_2c8,(_anonymous_namespace_ *)0x0,i_00);
  (anonymous_namespace)::Key1_abi_cxx11_(&local_288,(_anonymous_namespace_ *)0x10c8df,i_01);
  local_a0 = (Comparator *)local_2c8._0_8_;
  pcStack_98 = (char *)local_2c8._8_8_;
  local_b0 = local_288._M_dataplus._M_p._0_4_;
  uStack_ac = local_288._M_dataplus._M_p._4_4_;
  uStack_a8 = (undefined4)local_288._M_string_length;
  uStack_a4 = local_288._M_string_length._4_4_;
  (*local_2f0->_vptr_DB[0xb])();
  local_250._0_8_ = (Comparator *)0x100;
  local_250._8_8_ = (char *)0x0;
  iVar2 = (*local_2f0->_vptr_DB[6])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  local_268 = 0;
  (**(code **)(*plVar3 + 0x18))(plVar3);
  uVar7 = 1;
  while( true ) {
    cVar1 = (**(code **)(*plVar3 + 0x10))(plVar3);
    if (cVar1 == '\0') break;
    local_268 = uVar7;
    (**(code **)(*plVar3 + 0x30))(plVar3);
    uVar7 = uVar7 + 1;
  }
  (**(code **)(*plVar3 + 8))(plVar3);
  local_250[0] = 1;
  local_250._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue178_test.cc"
  ;
  local_240._0_4_ = 0x4f;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_240 + 8));
  this = leveldb::test::Tester::IsEq<int,unsigned_long>
                   ((Tester *)local_250,&(anonymous_namespace)::kNumKeys,&local_268);
  leveldb::test::Tester::operator<<(this,(char (*) [19])"Bad number of keys");
  leveldb::test::Tester::~Tester((Tester *)local_250);
  if (local_2f0 != (DB *)0x0) {
    (*local_2f0->_vptr_DB[1])();
  }
  leveldb::Options::Options((Options *)local_250);
  leveldb::DestroyDB((leveldb *)&local_260,&local_2e8,(Options *)local_250);
  if (local_260 != (void *)0x0) {
    operator_delete__(local_260);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((Comparator *)local_2c8._0_8_ != (Comparator *)(local_2c8 + 0x10)) {
    operator_delete((void *)local_2c8._0_8_);
  }
  leveldb::WriteBatch::~WriteBatch(&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Issue178, Test) {
  // Get rid of any state from an old run.
  std::string dbpath = leveldb::test::TmpDir() + "/leveldb_cbug_test";
  DestroyDB(dbpath, leveldb::Options());

  // Open database.  Disable compression since it affects the creation
  // of layers and the code below is trying to test against a very
  // specific scenario.
  leveldb::DB* db;
  leveldb::Options db_options;
  db_options.create_if_missing = true;
  db_options.compression = leveldb::kNoCompression;
  ASSERT_OK(leveldb::DB::Open(db_options, dbpath, &db));

  // create first key range
  leveldb::WriteBatch batch;
  for (size_t i = 0; i < kNumKeys; i++) {
    batch.Put(Key1(i), "value for range 1 key");
  }
  ASSERT_OK(db->Write(leveldb::WriteOptions(), &batch));

  // create second key range
  batch.Clear();
  for (size_t i = 0; i < kNumKeys; i++) {
    batch.Put(Key2(i), "value for range 2 key");
  }
  ASSERT_OK(db->Write(leveldb::WriteOptions(), &batch));

  // delete second key range
  batch.Clear();
  for (size_t i = 0; i < kNumKeys; i++) {
    batch.Delete(Key2(i));
  }
  ASSERT_OK(db->Write(leveldb::WriteOptions(), &batch));

  // compact database
  std::string start_key = Key1(0);
  std::string end_key = Key1(kNumKeys - 1);
  leveldb::Slice least(start_key.data(), start_key.size());
  leveldb::Slice greatest(end_key.data(), end_key.size());

  // commenting out the line below causes the example to work correctly
  db->CompactRange(&least, &greatest);

  // count the keys
  leveldb::Iterator* iter = db->NewIterator(leveldb::ReadOptions());
  size_t num_keys = 0;
  for (iter->SeekToFirst(); iter->Valid(); iter->Next()) {
    num_keys++;
  }
  delete iter;
  ASSERT_EQ(kNumKeys, num_keys) << "Bad number of keys";

  // close database
  delete db;
  DestroyDB(dbpath, leveldb::Options());
}